

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall
wabt::TypeChecker::EndTryTable(TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  Type *pTVar1;
  Type *pTVar2;
  LabelType local_24;
  unsigned_long local_20;
  
  local_24 = TryTable;
  local_20 = (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
  std::vector<wabt::TypeChecker::Label,std::allocator<wabt::TypeChecker::Label>>::
  emplace_back<wabt::LabelType&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,unsigned_long>
            ((vector<wabt::TypeChecker::Label,std::allocator<wabt::TypeChecker::Label>> *)
             &this->label_stack_,&local_24,param_types,result_types,&local_20);
  pTVar1 = (param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar2 = (param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    PushType(this,*pTVar2);
  }
  return (Result)Ok;
}

Assistant:

Result TypeChecker::EndTryTable(const TypeVector& param_types,
                                const TypeVector& result_types) {
  PushLabel(LabelType::TryTable, param_types, result_types);
  PushTypes(param_types);
  return Result::Ok;
}